

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.h
# Opt level: O1

int fy_emit_accum_utf8_put(fy_emit_accum *ea,int c)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar5;
  
  uVar9 = 1;
  if ((0x7f < c) && (uVar9 = 2, 0x7ff < c)) {
    uVar9 = (ulong)(0xffff < c) + 3;
  }
  while( true ) {
    uVar5 = ea->next;
    uVar6 = ea->alloc - uVar5;
    if (uVar9 <= uVar6) break;
    uVar4 = fy_emit_accum_grow(ea);
    uVar5 = (ulong)uVar4;
    if (uVar4 != 0) {
LAB_00127202:
      return (int)uVar5;
    }
  }
  if (0x10ffff < c || (c & 0xfffff800U) == 0xd800) goto LAB_00127202;
  uVar7 = 1;
  if ((0x7f < c) && (uVar7 = 2, 0x7ff < c)) {
    uVar7 = (ulong)(0xffff < c) + 3;
  }
  if (uVar6 < uVar7) goto LAB_00127202;
  pcVar3 = ea->accum;
  bVar8 = (byte)c;
  if (c < 0x80) {
    pcVar3[uVar5] = bVar8;
  }
  else if (c < 0x800) {
    pcVar3[uVar5] = (byte)((uint)c >> 6) | 0xc0;
    pcVar3[uVar5 + 1] = bVar8 & 0x3f | 0x80;
  }
  else if (c < 0x10000) {
    pcVar3[uVar5] = (byte)((uint)c >> 0xc) | 0xe0;
    pcVar3[uVar5 + 1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    pcVar3[uVar5 + 2] = bVar8 & 0x3f | 0x80;
  }
  else {
    pcVar3[uVar5] = (byte)((uint)c >> 0x12) | 0xf0;
    pcVar3[uVar5 + 1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
    pcVar3[uVar5 + 2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    pcVar3[uVar5 + 3] = bVar8 & 0x3f | 0x80;
  }
  ea->next = ea->next + uVar9;
  ea->utf8_count = ea->utf8_count + 1;
  if (c < 0x85) {
    if (c == 9) {
      iVar1 = ea->col;
      iVar2 = ea->ts;
      uVar5 = (long)iVar1 / (long)iVar2 & 0xffffffff;
      ea->col = (iVar1 + iVar2) - iVar1 % iVar2;
      goto LAB_00127202;
    }
    if ((c == 10) || (c == 0xd)) goto LAB_001271f8;
  }
  else {
    uVar5 = (ulong)(c - 0x2028U);
    if ((c - 0x2028U < 2) || (c == 0x85)) {
LAB_001271f8:
      ea->col = 0;
      goto LAB_00127202;
    }
  }
  ea->col = ea->col + 1;
  goto LAB_00127202;
}

Assistant:

static inline int
fy_emit_accum_utf8_put(struct fy_emit_accum *ea, int c) {
    size_t w;
    char *ss;
    int ret;

    /* grow if needed */
    w = fy_utf8_width(c);
    while (w > (ea->alloc - ea->next)) {
        ret = fy_emit_accum_grow(ea);
        if (ret != 0)
            return ret;
    }
    ss = fy_utf8_put(ea->accum + ea->next, ea->alloc - ea->next, c);
    if (!ss)
        return -1;
    ea->next += w;
    ea->utf8_count++;
    if (fy_is_lb(c))
        ea->col = 0;
    else if (fy_is_tab(c))
        ea->col += (ea->ts - (ea->col % ea->ts));
    else
        ea->col++;

    return 0;
}